

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryMLT.hpp
# Opt level: O2

void __thiscall
ddd::DictionaryMLT<true,_false>::DictionaryMLT(DictionaryMLT<true,_false> *this,istream *is)

{
  pointer __p;
  size_t i;
  pointer pDVar1;
  long lVar2;
  bool has_trie;
  size_t num_suffixes;
  bool local_59;
  pointer local_58;
  pointer local_50;
  DictionaryMLT<true,_false> *local_48;
  DictionaryMLT<true,_false> *local_40;
  DictionaryMLT<true,_false> *local_38;
  
  *(undefined ***)this = &PTR__DictionaryMLT_0013ab98;
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x18) = 0;
  *(undefined8 *)(this + 0x20) = 0;
  *(undefined4 *)(this + 0x28) = 0xffffffff;
  *(undefined8 *)(this + 0x30) = 0;
  local_48 = this + 8;
  make_unique<ddd::DaTrie<true,false,true>,std::istream&>((ddd *)&local_58,is);
  pDVar1 = local_58;
  local_58 = (pointer)0x0;
  std::
  __uniq_ptr_impl<ddd::DaTrie<true,_false,_true>,_std::default_delete<ddd::DaTrie<true,_false,_true>_>_>
  ::reset((__uniq_ptr_impl<ddd::DaTrie<true,_false,_true>,_std::default_delete<ddd::DaTrie<true,_false,_true>_>_>
           *)(this + 8),pDVar1);
  std::
  unique_ptr<ddd::DaTrie<true,_false,_true>,_std::default_delete<ddd::DaTrie<true,_false,_true>_>_>
  ::~unique_ptr((unique_ptr<ddd::DaTrie<true,_false,_true>,_std::default_delete<ddd::DaTrie<true,_false,_true>_>_>
                 *)&local_58);
  local_58 = (pointer)0x0;
  utils::read_value<unsigned_long>((unsigned_long *)&local_58,is);
  std::
  vector<std::unique_ptr<ddd::DaTrie<true,_false,_false>,_std::default_delete<ddd::DaTrie<true,_false,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<true,_false,_false>,_std::default_delete<ddd::DaTrie<true,_false,_false>_>_>_>_>
  ::resize((vector<std::unique_ptr<ddd::DaTrie<true,_false,_false>,_std::default_delete<ddd::DaTrie<true,_false,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<true,_false,_false>,_std::default_delete<ddd::DaTrie<true,_false,_false>_>_>_>_>
            *)(this + 0x10),(size_type)local_58);
  local_40 = this + 0x28;
  local_38 = this + 0x30;
  lVar2 = 0;
  for (pDVar1 = (pointer)0x0; pDVar1 < local_58;
      pDVar1 = (pointer)((long)&(pDVar1->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>.
                                _M_impl.super__Vector_impl_data._M_start + 1)) {
    local_59 = false;
    utils::read_value<bool>(&local_59,is);
    if (local_59 == true) {
      make_unique<ddd::DaTrie<true,false,false>,std::istream&>((ddd *)&local_50,is);
      __p = local_50;
      local_50 = (pointer)0x0;
      std::
      __uniq_ptr_impl<ddd::DaTrie<true,_false,_false>,_std::default_delete<ddd::DaTrie<true,_false,_false>_>_>
      ::reset((__uniq_ptr_impl<ddd::DaTrie<true,_false,_false>,_std::default_delete<ddd::DaTrie<true,_false,_false>_>_>
               *)(*(long *)(this + 0x10) + lVar2),__p);
      std::
      unique_ptr<ddd::DaTrie<true,_false,_false>,_std::default_delete<ddd::DaTrie<true,_false,_false>_>_>
      ::~unique_ptr((unique_ptr<ddd::DaTrie<true,_false,_false>,_std::default_delete<ddd::DaTrie<true,_false,_false>_>_>
                     *)&local_50);
    }
    lVar2 = lVar2 + 8;
  }
  utils::read_value<unsigned_int>((uint *)local_40,is);
  utils::read_value<unsigned_long>((unsigned_long *)local_38,is);
  return;
}

Assistant:

DictionaryMLT(std::istream& is) {
    prefix_subtrie_ = make_unique<PrefixTrieType>(is);
    size_t num_suffixes = 0;
    utils::read_value(num_suffixes, is);
    suffix_subtries_.resize(num_suffixes);
    for (size_t i = 0; i < num_suffixes; ++i) {
      bool has_trie{};
      utils::read_value(has_trie, is);
      if (has_trie) {
        suffix_subtries_[i] = make_unique<SuffixTrieType>(is);
      }
    }
    utils::read_value(suffix_head_, is);
    utils::read_value(num_keys_, is);
  }